

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result wabt::ReadBinaryIr(char *filename,void *data,size_t size,ReadBinaryOptions *options,
                         Errors *errors,Module *out_module)

{
  Result RVar1;
  BinaryReaderIR reader;
  BinaryReaderIR local_60;
  
  local_60.super_BinaryReaderNop.super_BinaryReaderDelegate.state = (State *)0x0;
  local_60.super_BinaryReaderNop.super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
       (_func_int **)&PTR__BinaryReaderIR_001bbe78;
  local_60.current_func_ = (Func *)0x0;
  local_60.label_stack_.
  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.label_stack_.
  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.label_stack_.
  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.current_init_expr_ = (ExprList *)0x0;
  local_60.errors_ = errors;
  local_60.module_ = out_module;
  local_60.filename_ = filename;
  RVar1 = ReadBinary(data,size,(BinaryReaderDelegate *)&local_60,options);
  anon_unknown_78::BinaryReaderIR::~BinaryReaderIR(&local_60);
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinaryIr(const char* filename,
                    const void* data,
                    size_t size,
                    const ReadBinaryOptions& options,
                    Errors* errors,
                    Module* out_module) {
  BinaryReaderIR reader(out_module, filename, errors);
  return ReadBinary(data, size, &reader, options);
}